

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashPtr,_int>::growTables(btHashMap<btHashPtr,_int> *this,btHashPtr *param_2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  btHashPtr *this_00;
  btAlignedObjectArray<int> *in_RDI;
  int hashValue;
  int i;
  int curHashtableSize;
  int newCapacity;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  uint in_stack_ffffffffffffffe0;
  uint uVar5;
  
  iVar1 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
  iVar2 = btAlignedObjectArray<int>::size(in_RDI);
  if (iVar2 < iVar1) {
    iVar2 = btAlignedObjectArray<int>::size(in_RDI);
    uVar5 = 0;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)(ulong)in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc,(int *)in_RDI);
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)((ulong)uVar5 << 0x20),in_stack_ffffffffffffffdc,
               (int *)in_RDI);
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      piVar3 = btAlignedObjectArray<int>::operator[](in_RDI,iVar4);
      *piVar3 = -1;
    }
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      piVar3 = btAlignedObjectArray<int>::operator[](in_RDI + 1,iVar4);
      *piVar3 = -1;
    }
    iVar1 = 0;
    while (iVar1 < iVar2) {
      this_00 = btAlignedObjectArray<btHashPtr>::operator[]
                          ((btAlignedObjectArray<btHashPtr> *)(in_RDI + 3),iVar1);
      uVar5 = btHashPtr::getHash(this_00);
      iVar4 = btAlignedObjectArray<int>::capacity(in_RDI + 2);
      uVar5 = uVar5 & iVar4 - 1U;
      piVar3 = btAlignedObjectArray<int>::operator[](in_RDI,uVar5);
      iVar4 = *piVar3;
      piVar3 = btAlignedObjectArray<int>::operator[](in_RDI + 1,iVar1);
      *piVar3 = iVar4;
      iVar4 = iVar1;
      piVar3 = btAlignedObjectArray<int>::operator[](in_RDI,uVar5);
      *piVar3 = iVar1;
      iVar1 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void	growTables(const Key& /*key*/)
	{
		int newCapacity = m_valueArray.capacity();

		if (m_hashTable.size() < newCapacity)
		{
			//grow hashtable and next table
			int curHashtableSize = m_hashTable.size();

			m_hashTable.resize(newCapacity);
			m_next.resize(newCapacity);

			int i;

			for (i= 0; i < newCapacity; ++i)
			{
				m_hashTable[i] = BT_HASH_NULL;
			}
			for (i = 0; i < newCapacity; ++i)
			{
				m_next[i] = BT_HASH_NULL;
			}

			for(i=0;i<curHashtableSize;i++)
			{
				//const Value& value = m_valueArray[i];
				//const Key& key = m_keyArray[i];

				int	hashValue = m_keyArray[i].getHash() & (m_valueArray.capacity()-1);	// New hash value with new mask
				m_next[i] = m_hashTable[hashValue];
				m_hashTable[hashValue] = i;
			}


		}
	}